

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
FastVector<unsigned_int,_false,_false>::FastVector
          (FastVector<unsigned_int,_false,_false> *this,uint reserved)

{
  uint *puVar1;
  
  puVar1 = (uint *)(*(code *)NULLC::alloc)(reserved * 4 + 4);
  this->data = puVar1;
  if (puVar1 != (uint *)0x0) {
    this->max = reserved;
    this->count = 0;
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x1c,
                "FastVector<unsigned int>::FastVector(unsigned int) [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

explicit FastVector(unsigned reserved)
	{
		if(!skipConstructor)
			data = NULLC::construct<T>(reserved);
		else
			data = (T*)NULLC::alignedAlloc(sizeof(T) * reserved);

		assert(data);

		if(zeroNewMemory)
			NULLC::fillMemory(data, 0, reserved * sizeof(T));

		max = reserved;
		count = 0;
	}